

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# egl_context.c
# Opt level: O0

void destroyContextEGL(_GLFWwindow *window)

{
  _GLFWwindow *window_local;
  
  if (((_glfw.platform.platformID != 0x60004) || ((window->context).client != 0x30001)) &&
     ((window->context).egl.client != (void *)0x0)) {
    _glfwPlatformFreeModule((window->context).egl.client);
    (window->context).egl.client = (void *)0x0;
  }
  if ((window->context).egl.surface != (EGLSurface)0x0) {
    (*_glfw.egl.DestroySurface)(_glfw.egl.display,(window->context).egl.surface);
    (window->context).egl.surface = (EGLSurface)0x0;
  }
  if ((window->context).egl.handle != (EGLContext)0x0) {
    (*_glfw.egl.DestroyContext)(_glfw.egl.display,(window->context).egl.handle);
    (window->context).egl.handle = (EGLContext)0x0;
  }
  return;
}

Assistant:

static void destroyContextEGL(_GLFWwindow* window)
{
    // NOTE: Do not unload libGL.so.1 while the X11 display is still open,
    //       as it will make XCloseDisplay segfault
    if (_glfw.platform.platformID != GLFW_PLATFORM_X11 ||
        window->context.client != GLFW_OPENGL_API)
    {
        if (window->context.egl.client)
        {
            _glfwPlatformFreeModule(window->context.egl.client);
            window->context.egl.client = NULL;
        }
    }

    if (window->context.egl.surface)
    {
        eglDestroySurface(_glfw.egl.display, window->context.egl.surface);
        window->context.egl.surface = EGL_NO_SURFACE;
    }

    if (window->context.egl.handle)
    {
        eglDestroyContext(_glfw.egl.display, window->context.egl.handle);
        window->context.egl.handle = EGL_NO_CONTEXT;
    }
}